

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectList.cpp
# Opt level: O1

bool __thiscall ObjectList::CreateBoundingBox(ObjectList *this,float t_start,float t_end,AABB *aabb)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  AABB _temp_aabb;
  AABB local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((this->m_size < 1) ||
     (iVar1 = (*(*this->m_list)->_vptr_Object[3])(*this->m_list,&local_60), (char)iVar1 == '\0')) {
    bVar2 = false;
  }
  else {
    *(undefined8 *)((aabb->m_max).e + 1) = local_60.m_max.e._4_8_;
    *(undefined8 *)(aabb->m_min).e = local_60.m_min.e._0_8_;
    *(undefined8 *)((aabb->m_min).e + 2) = local_60._8_8_;
    bVar2 = this->m_size < 2;
    if ((1 < this->m_size) &&
       (iVar1 = (*this->m_list[1]->_vptr_Object[3])(t_start,t_end,this->m_list[1],&local_60),
       (char)iVar1 != '\0')) {
      lVar3 = 2;
      do {
        AABB::Merge(aabb,&local_60);
        *(undefined8 *)((aabb->m_max).e + 1) = local_38;
        *(undefined8 *)(aabb->m_min).e = local_48;
        *(undefined8 *)((aabb->m_min).e + 2) = uStack_40;
        bVar2 = this->m_size <= lVar3;
        if (this->m_size <= lVar3) {
          return bVar2;
        }
        iVar1 = (*this->m_list[lVar3]->_vptr_Object[3])(t_start,t_end,this->m_list[lVar3],&local_60)
        ;
        lVar3 = lVar3 + 1;
      } while ((char)iVar1 != '\0');
    }
  }
  return bVar2;
}

Assistant:

bool 
ObjectList::CreateBoundingBox(float t_start, float t_end, AABB& aabb) const
{
    if(m_size < 1) {
        return false;
    }

    AABB _temp_aabb;
    if(m_list[0]->CreateBoundingBox(t_start, t_end, _temp_aabb)) {
        aabb = _temp_aabb;
    }
    else {
        return false;
    }

    for (int i = 1; i < m_size; i++) {
        if(!m_list[i]->CreateBoundingBox(t_start, t_end, _temp_aabb)) {
            return false;
        }
        aabb = AABB::Merge(aabb, _temp_aabb);
    }

    return true;
}